

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O3

void Abc_NodeLeavesRemove(Vec_Ptr_t *vLeaves,uint uPhase,int nVars)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  if (0 < nVars) {
    uVar5 = (ulong)(uint)nVars;
    do {
      uVar1 = uVar5 - 1;
      if ((uPhase >> ((uint)uVar1 & 0x1f) & 1) != 0) {
        uVar2 = vLeaves->nSize;
        if ((long)(int)uVar2 < (long)uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar7 = (ulong)uVar2 + 1;
        do {
          if ((int)lVar7 + -1 < 1) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
          }
          lVar6 = lVar7 + -1;
          lVar4 = lVar7 + -2;
          lVar7 = lVar6;
        } while (vLeaves->pArray[lVar4] != vLeaves->pArray[uVar1]);
        for (; (int)lVar6 < (int)uVar2; lVar6 = lVar6 + 1) {
          vLeaves->pArray[lVar6 + -1] = vLeaves->pArray[lVar6];
        }
        vLeaves->nSize = uVar2 - 1;
      }
      bVar3 = 1 < (long)uVar5;
      uVar5 = uVar1;
    } while (bVar3);
  }
  return;
}

Assistant:

void Abc_NodeLeavesRemove( Vec_Ptr_t * vLeaves, unsigned uPhase, int nVars )
{
    int i;
    for ( i = nVars - 1; i >= 0; i-- )
        if ( uPhase & (1 << i) )
            Vec_PtrRemove( vLeaves, Vec_PtrEntry(vLeaves, i) );
}